

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

void __thiscall
kratos::SystemVerilogCodeGen::SystemVerilogCodeGen
          (SystemVerilogCodeGen *this,Generator *generator,SystemVerilogCodeGenOptions *options)

{
  bool bVar1;
  unordered_map<kratos::StmtBlock_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::StmtBlock_*>,_std::equal_to<kratos::StmtBlock_*>,_std::allocator<std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  SystemVerilogCodeGenOptions *local_20;
  SystemVerilogCodeGenOptions *options_local;
  Generator *generator_local;
  SystemVerilogCodeGen *this_local;
  
  this->_vptr_SystemVerilogCodeGen = (_func_int **)&PTR_dispatch_node_00587930;
  this->indent_size = 2;
  this->indent_ = 0;
  local_20 = options;
  options_local = (SystemVerilogCodeGenOptions *)generator;
  generator_local = (Generator *)this;
  std::__cxx11::string::string((string *)&this->empty_indent_str_);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&this->empty_indent_string_view_);
  this->generator_ = (Generator *)options_local;
  this->skip_indent_ = false;
  std::
  unordered_map<kratos::StmtBlock_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::StmtBlock_*>,_std::equal_to<kratos::StmtBlock_*>,_std::allocator<std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map(&this->label_index_);
  SystemVerilogCodeGenOptions::SystemVerilogCodeGenOptions(&this->options_,options);
  Stream::Stream(&this->stream_,(Generator *)options_local,this);
  bVar1 = Generator::external((Generator *)options_local);
  if (!bVar1) {
    index_named_block_abi_cxx11_(&local_68,this);
    std::
    unordered_map<kratos::StmtBlock_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::StmtBlock_*>,_std::equal_to<kratos::StmtBlock_*>,_std::allocator<std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=(&this->label_index_,&local_68);
    std::
    unordered_map<kratos::StmtBlock_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::StmtBlock_*>,_std::equal_to<kratos::StmtBlock_*>,_std::allocator<std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~unordered_map(&local_68);
    check_yosys_src(this);
  }
  return;
}

Assistant:

SystemVerilogCodeGen::SystemVerilogCodeGen(kratos::Generator* generator,
                                           SystemVerilogCodeGenOptions options)
    : generator_(generator), options_(std::move(options)), stream_(generator, this) {
    // if it's an external file, we don't output anything
    if (generator->external()) return;

    // index the named blocks
    label_index_ = index_named_block();

    // check if we need to inline src attribute with yosys
    check_yosys_src();
}